

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::Compaction::AddInputDeletions(Compaction *this,VersionEdit *edit)

{
  long lVar1;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *pvVar2;
  VersionEdit *in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  size_t i;
  int which;
  VersionEdit *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_00;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *pvVar3;
  int local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    this_00 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)0x0;
    while( true ) {
      pvVar3 = this_00;
      pvVar2 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                         ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           *)in_stack_ffffffffffffffb8);
      if (pvVar2 <= this_00) break;
      in_stack_ffffffffffffffb8 = in_RSI;
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator[]
                (this_00,CONCAT44(*in_RDI + local_1c,in_stack_ffffffffffffffc0));
      VersionEdit::DeleteFile
                (in_stack_ffffffffffffffb8,(int)((ulong)pvVar3 >> 0x20),(uint64_t)in_RDI);
      this_00 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                ((long)&(pvVar3->
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Compaction::AddInputDeletions(VersionEdit* edit) {
  for (int which = 0; which < 2; which++) {
    for (size_t i = 0; i < inputs_[which].size(); i++) {
      edit->DeleteFile(level_ + which, inputs_[which][i]->number);
    }
  }
}